

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxu32 Systrcpy(char *zDest,sxu32 nDestLen,char *zSrc,sxu32 nLen)

{
  char *pcVar1;
  sxu32 sVar2;
  long lVar3;
  char *pcVar4;
  
  if (nLen == 0) {
    nLen = SyStrlen(zSrc);
  }
  pcVar4 = zDest + (nDestLen - 1);
  for (lVar3 = 0; (pcVar1 = zDest + lVar3, pcVar1 < pcVar4 && (sVar2 = (sxu32)lVar3, nLen != sVar2))
      ; lVar3 = lVar3 + 4) {
    pcVar1 = zDest + lVar3 + 1;
    zDest[lVar3] = zSrc[lVar3];
    if ((pcVar4 <= pcVar1) || (nLen - 1 == sVar2)) break;
    pcVar1 = zDest + lVar3 + 2;
    zDest[lVar3 + 1] = zSrc[lVar3 + 1];
    if ((pcVar4 <= pcVar1) || (nLen - 2 == sVar2)) break;
    pcVar1 = zDest + lVar3 + 3;
    zDest[lVar3 + 2] = zSrc[lVar3 + 2];
    if ((pcVar4 <= pcVar1) || (nLen - 3 == sVar2)) break;
    *pcVar1 = zSrc[lVar3 + 3];
  }
  *pcVar1 = '\0';
  return (int)pcVar1 - (int)zDest;
}

Assistant:

JX9_PRIVATE sxu32 Systrcpy(char *zDest, sxu32 nDestLen, const char *zSrc, sxu32 nLen)
{
	unsigned char *zBuf = (unsigned char *)zDest;
	unsigned char *zIn = (unsigned char *)zSrc;
	unsigned char *zEnd;
#if defined(UNTRUST)
	if( zSrc == (const char *)zDest ){
			return 0;
	}
#endif
	if( nLen <= 0 ){
		nLen = SyStrlen(zSrc);
	}
	zEnd = &zBuf[nDestLen - 1]; /* reserve a room for the null terminator */
	for(;;){
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
		if( zBuf >= zEnd || nLen == 0 ){ break;} zBuf[0] = zIn[0]; zIn++; zBuf++; nLen--;
	}
	zBuf[0] = 0;
	return (sxu32)(zBuf-(unsigned char *)zDest);
}